

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void sdl_audio_callback(void *client,uint8_t *stream,int len)

{
  size_t sVar1;
  size_t dst_size;
  bool bVar2;
  
  sVar1 = ring_buf_available(&audio_ring_buf);
  latency_avg = latency_avg * 0.9 + ((float)(sVar1 >> 1) / 44100.0) * 1000.0 * 0.1;
  dst_size = (size_t)len;
  if (len <= (int)sVar1) {
    sVar1 = ring_buf_read(&audio_ring_buf,stream,dst_size);
    bVar2 = dst_size < sVar1;
    dst_size = dst_size - sVar1;
    if (bVar2 || dst_size == 0) {
      return;
    }
    stream = stream + sVar1;
  }
  memset(stream,0,dst_size);
  return;
}

Assistant:

void sdl_audio_callback(void* client, uint8_t* stream, int len)
{
    float latency = ((ring_buf_available(&audio_ring_buf) >> 1) / (float)SAMPLE_RATE) * 1000.0f;
    latency_avg = (latency_avg * 0.9f + latency * 0.1f);

    //printf("read latency: %.2f ms  avg: %.2f ms\n", latency, latency_avg);

    int available = (int)ring_buf_available(&audio_ring_buf);
    if (available >= len)
    {
        size_t read = ring_buf_read(&audio_ring_buf, stream, len);
        if (read < len)
            memset(stream + read, 0, len - read);
    }
    else
    {
        memset(stream, 0, len);
    }
}